

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Intercom_Control_PDU::Encode(Intercom_Control_PDU *this,KDataStream *stream)

{
  pointer pIVar1;
  pointer pIVar2;
  
  Header7::Encode(&this->super_Header,stream);
  KDataStream::Write(stream,(this->super_Header).super_Header6.field_0x27);
  (*(this->m_CommChannelType).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_CommChannelType,stream);
  (*(this->m_SrcEnt).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_SrcEnt,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16SrcCommDevID);
  KDataStream::Write(stream,this->m_ui8SrcLineID);
  KDataStream::Write(stream,this->m_ui8TransmitPriority);
  KDataStream::Write(stream,this->m_ui8TransmitLineState);
  KDataStream::Write(stream,this->m_ui8Command);
  (*(this->m_MstrEntID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_MstrEntID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16MstrCommDeviceID);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16MstrChannelID);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32IntrParamLen);
  pIVar1 = (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar2 = (this->m_vICP).
                super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    (*(pIVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pIVar2,stream);
  }
  return;
}

Assistant:

void Intercom_Control_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << m_ui8CtrlTyp
           << KDIS_STREAM m_CommChannelType
           << KDIS_STREAM m_SrcEnt
           << m_ui16SrcCommDevID
           << m_ui8SrcLineID
           << m_ui8TransmitPriority
           << m_ui8TransmitLineState
           << m_ui8Command
           << KDIS_STREAM m_MstrEntID
           << m_ui16MstrCommDeviceID
           << m_ui16MstrChannelID
           << m_ui32IntrParamLen;

    vector<IntercomCommunicationParameters>::const_iterator citr = m_vICP.begin();
    vector<IntercomCommunicationParameters>::const_iterator citrEnd = m_vICP.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << KDIS_STREAM *citr;
    }
}